

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

string * __thiscall Tokenizer::type(string *__return_storage_ptr__,Tokenizer *this,string *token)

{
  size_type sVar1;
  size_type sVar2;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_1c;
  allocator<char> local_1b;
  allocator<char> local_1a;
  allocator<char> local_19;
  
  sVar1 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::count
                    (&this->symbol_map,(token->_M_dataplus)._M_p);
  if (sVar1 == 0) {
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::count(&this->keyword_map,token);
    if (sVar2 == 0) {
      if (*(token->_M_dataplus)._M_p != '_') {
        std::__cxx11::stoi(token,(size_t *)0x0,10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"INT_CONST",&local_1c);
        return __return_storage_ptr__;
      }
      __s = "STRING_CONST";
      __a = &local_1b;
    }
    else {
      __s = "KEYWORD";
      __a = &local_1a;
    }
  }
  else {
    __s = "SYMBOL";
    __a = &local_19;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string Tokenizer::type(const std::string& token) {
    if (symbol_map.count(token[0]) > 0) {
        return "SYMBOL";
    }

    else if (keyword_map.count(token) > 0) {
        return "KEYWORD";
    }

    else if (token[0] == '_') {
        return "STRING_CONST";
    }

    try {
        int val = std::stoi(token);
        return "INT_CONST";
    }
    catch (std::exception& e) {
        return "IDENTIFIER";
    }
}